

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

void __thiscall jbcoin::STAmount::canonicalize(STAmount *this)

{
  ulong uVar1;
  int iVar2;
  mantissa_type mVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  if ((this->mIssue).currency.pn[0] == 0) {
    uVar4 = 0;
    do {
      uVar1 = uVar4;
      if (uVar1 == 4) {
        uVar1 = 4;
        break;
      }
      uVar4 = uVar1 + 1;
    } while ((this->mIssue).currency.pn[uVar1 + 1] == 0);
    if (3 < uVar1) {
      this->mIsNative = true;
      if (this->mValue != 0) {
        iVar2 = this->mOffset;
        if (iVar2 < 0) {
          uVar4 = this->mValue;
          do {
            uVar4 = uVar4 / 10;
            iVar2 = iVar2 + 1;
          } while (iVar2 != 0);
          this->mValue = uVar4;
          this->mOffset = 0;
        }
        if (0 < this->mOffset) {
          mVar3 = this->mValue;
          iVar2 = this->mOffset + 1;
          do {
            mVar3 = mVar3 * 10;
            iVar2 = iVar2 + -1;
          } while (1 < iVar2);
          this->mValue = mVar3;
          this->mOffset = 0;
        }
        if (this->mValue < 0x16345785d8a0001) {
          return;
        }
        Throw<std::runtime_error,char_const(&)[36]>
                  ((char (*) [36])"Native currency amount out of range");
      }
      this->mOffset = 0;
      goto LAB_001b0268;
    }
  }
  this->mIsNative = false;
  if (this->mValue != 0) {
    if (this->mValue < 1000000000000000) {
      iVar2 = this->mOffset;
      uVar4 = this->mValue;
      do {
        if (iVar2 < -0x5f) break;
        this->mValue = uVar4 * 10;
        iVar2 = iVar2 + -1;
        this->mOffset = iVar2;
        bVar6 = uVar4 < 100000000000000;
        uVar4 = uVar4 * 10;
      } while (bVar6);
    }
    uVar4 = this->mValue;
    if (9999999999999999 < uVar4) {
      iVar2 = this->mOffset;
      iVar5 = 0x50;
      if (0x50 < iVar2) {
        iVar5 = iVar2;
      }
      uVar1 = uVar4;
      do {
        iVar2 = iVar2 + 1;
        if (iVar2 - iVar5 == 1) goto LAB_001b02cd;
        uVar4 = uVar1 / 10;
        this->mValue = uVar4;
        this->mOffset = iVar2;
        bVar6 = 99999999999999999 < uVar1;
        uVar1 = uVar4;
      } while (bVar6);
    }
    iVar2 = this->mOffset;
    if (uVar4 < 1000000000000000 || iVar2 < -0x60) {
      this->mValue = 0;
      this->mIsNegative = false;
      this->mOffset = -100;
      return;
    }
    if (iVar2 < 0x51) {
      if (iVar2 < -0x60 && uVar4 != 0) {
        __assert_fail("(mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                      ,0x2bd,"void jbcoin::STAmount::canonicalize()");
      }
      if (iVar2 != -100 || uVar4 != 0) {
        return;
      }
      __assert_fail("(mValue != 0) || (mOffset != -100)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                    ,0x2be,"void jbcoin::STAmount::canonicalize()");
    }
LAB_001b02cd:
    Throw<std::runtime_error,char_const(&)[15]>((char (*) [15])0x27bcb5);
  }
  this->mOffset = -100;
LAB_001b0268:
  this->mIsNegative = false;
  return;
}

Assistant:

void STAmount::canonicalize ()
{
    if (isXRP (*this))
    {
        // native currency amounts should always have an offset of zero
        mIsNative = true;

        if (mValue == 0)
        {
            mOffset = 0;
            mIsNegative = false;
            return;
        }

        while (mOffset < 0)
        {
            mValue /= 10;
            ++mOffset;
        }

        while (mOffset > 0)
        {
            mValue *= 10;
            --mOffset;
        }

        if (mValue > cMaxNativeN)
            Throw<std::runtime_error> ("Native currency amount out of range");

        return;
    }

    mIsNative = false;

    if (mValue == 0)
    {
        mOffset = -100;
        mIsNegative = false;
        return;
    }

    while ((mValue < cMinValue) && (mOffset > cMinOffset))
    {
        mValue *= 10;
        --mOffset;
    }

    while (mValue > cMaxValue)
    {
        if (mOffset >= cMaxOffset)
            Throw<std::runtime_error> ("value overflow");

        mValue /= 10;
        ++mOffset;
    }

    if ((mOffset < cMinOffset) || (mValue < cMinValue))
    {
        mValue = 0;
        mIsNegative = false;
        mOffset = -100;
        return;
    }

    if (mOffset > cMaxOffset)
        Throw<std::runtime_error> ("value overflow");

    assert ((mValue == 0) || ((mValue >= cMinValue) && (mValue <= cMaxValue)));
    assert ((mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset)));
    assert ((mValue != 0) || (mOffset != -100));
}